

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_examples.cpp
# Opt level: O2

void example1(char *filename,char *file_Y,char *file_Cb,char *file_Cr,char *file_rgb_recov)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  BITMAPINFOHEADER bmInfo;
  BITMAPINFOHEADER bmInfo_00;
  BITMAPINFOHEADER bmInfo_01;
  BITMAPINFOHEADER bmInfo_02;
  BITMAPINFOHEADER bmInfo_03;
  BITMAPINFOHEADER bmInfo_04;
  BITMAPINFOHEADER bmInfo_05;
  BITMAPINFOHEADER bmInfo_06;
  BITMAPINFOHEADER bmInfo_07;
  BITMAPINFOHEADER bmInfo_08;
  BITMAPINFOHEADER bmInfo_09;
  BITMAPINFOHEADER bmInfo_10;
  uint w;
  uint h;
  TRIPLEBYTES **mrx1;
  TRIPLEYCbCr **mrx;
  TRIPLERGB **mrxY;
  TRIPLERGB **mrxCb;
  TRIPLERGB **mrxCr;
  TRIPLEBYTES **mrx2;
  ostream *poVar7;
  int *piVar8;
  ulong h_00;
  int N;
  int i;
  ulong uVar9;
  BITMAPFILEHEADER bmFileDef;
  BITMAPINFOHEADER bmInfoDef;
  
  std::operator<<((ostream *)&std::cout,"reading file...\n");
  system("mkdir -p images");
  system("mkdir -p histograms");
  mrx1 = (TRIPLEBYTES **)loadBMPFile(&bmFileDef,&bmInfoDef,filename);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  bmInfo.biPlanes = bmInfoDef.biPlanes;
  bmInfo.biBitCount = bmInfoDef.biBitCount;
  bmInfo.biHeight = bmInfoDef.biHeight;
  bmInfo.biWidth = bmInfoDef.biWidth;
  bmInfo.biSize = bmInfoDef.biSize;
  bmInfo.biCompression = bmInfoDef.biCompression;
  bmInfo.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo.biClrImportant = bmInfoDef.biClrImportant;
  printHeader(bmFileDef,bmInfo);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  h = bmInfoDef.biHeight;
  w = bmInfoDef.biWidth;
  h_00 = (ulong)bmInfoDef.biHeight;
  mrx = RGB2YCbCr((TRIPLERGB **)mrx1,h_00,(ulong)bmInfoDef.biWidth);
  bmInfo_00.biPlanes = bmInfoDef.biPlanes;
  bmInfo_00.biBitCount = bmInfoDef.biBitCount;
  bmInfo_00.biHeight = bmInfoDef.biHeight;
  bmInfo_00.biWidth = bmInfoDef.biWidth;
  bmInfo_00.biSize = bmInfoDef.biSize;
  bmInfo_00.biCompression = bmInfoDef.biCompression;
  bmInfo_00.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_00.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_00.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_00.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_00.biClrImportant = bmInfoDef.biClrImportant;
  save_components_to_files
            ((TRIPLERGB **)mrx1,bmFileDef,bmInfo_00,0,"file_Red.bmp","file_Green.bmp",
             "file_Blue.bmp");
  bmInfo_01.biPlanes = bmInfoDef.biPlanes;
  bmInfo_01.biBitCount = bmInfoDef.biBitCount;
  bmInfo_01.biHeight = bmInfoDef.biHeight;
  bmInfo_01.biWidth = bmInfoDef.biWidth;
  bmInfo_01.biSize = bmInfoDef.biSize;
  bmInfo_01.biCompression = bmInfoDef.biCompression;
  bmInfo_01.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_01.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_01.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_01.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_01.biClrImportant = bmInfoDef.biClrImportant;
  save_components_to_files
            ((TRIPLERGB **)mrx,bmFileDef,bmInfo_01,1,"file_Y.bmp","file_Cb.bmp","file_Cr.bmp");
  mrxY = loadBMPFile(&bmFileDef,&bmInfoDef,file_Y);
  mrxCb = loadBMPFile(&bmFileDef,&bmInfoDef,file_Cb);
  mrxCr = loadBMPFile(&bmFileDef,&bmInfoDef,file_Cr);
  mrx2 = (TRIPLEBYTES **)YCbCr2RGB(mrxY,mrxCb,mrxCr,h,w);
  bmInfo_02.biPlanes = bmInfoDef.biPlanes;
  bmInfo_02.biBitCount = bmInfoDef.biBitCount;
  bmInfo_02.biHeight = bmInfoDef.biHeight;
  bmInfo_02.biWidth = bmInfoDef.biWidth;
  bmInfo_02.biSize = bmInfoDef.biSize;
  bmInfo_02.biCompression = bmInfoDef.biCompression;
  bmInfo_02.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_02.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_02.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_02.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_02.biClrImportant = bmInfoDef.biClrImportant;
  saveBMPFile(bmFileDef,bmInfo_02,(TRIPLERGB **)mrx2,file_rgb_recov);
  dVar1 = getPSNR(mrx1,mrx2,0,0,h,w,0);
  dVar2 = getPSNR(mrx1,mrx2,0,0,h,w,1);
  dVar3 = getPSNR(mrx1,mrx2,0,0,h,w,2);
  checkCorrelationProperties((TRIPLERGB **)mrx1,h,w,0);
  checkCorrelationProperties((TRIPLERGB **)mrx,h,w,1);
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"PSNR(red)[RGB, RGBr] = ");
  poVar7 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"PSNR(green)[RGB, RGBr] = ");
  poVar7 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"PSNR(blue)[RGB, RGBr] = ");
  poVar7 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"mean\" x2:\n");
  bmInfo_03.biPlanes = bmInfoDef.biPlanes;
  bmInfo_03.biBitCount = bmInfoDef.biBitCount;
  bmInfo_03.biHeight = bmInfoDef.biHeight;
  bmInfo_03.biWidth = bmInfoDef.biWidth;
  bmInfo_03.biSize = bmInfoDef.biSize;
  bmInfo_03.biCompression = bmInfoDef.biCompression;
  bmInfo_03.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_03.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_03.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_03.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_03.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCb,bmFileDef,bmInfo_03,1,2,"images/decMeanCb2.bmp","images/recMeanCb2.bmp");
  bmInfo_04.biPlanes = bmInfoDef.biPlanes;
  bmInfo_04.biBitCount = bmInfoDef.biBitCount;
  bmInfo_04.biHeight = bmInfoDef.biHeight;
  bmInfo_04.biWidth = bmInfoDef.biWidth;
  bmInfo_04.biSize = bmInfoDef.biSize;
  bmInfo_04.biCompression = bmInfoDef.biCompression;
  bmInfo_04.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_04.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_04.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_04.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_04.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCr,bmFileDef,bmInfo_04,1,2,"images/decMeanCr2.bmp","images/recMeanCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recMeanCb2.bmp","images/recMeanCr2.bmp",
             "images/recoveryMeanRGB2.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"mean\" x4:\n");
  bmInfo_05.biPlanes = bmInfoDef.biPlanes;
  bmInfo_05.biBitCount = bmInfoDef.biBitCount;
  bmInfo_05.biHeight = bmInfoDef.biHeight;
  bmInfo_05.biWidth = bmInfoDef.biWidth;
  bmInfo_05.biSize = bmInfoDef.biSize;
  bmInfo_05.biCompression = bmInfoDef.biCompression;
  bmInfo_05.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_05.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_05.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_05.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_05.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCb,bmFileDef,bmInfo_05,1,4,"images/decMeanCb4.bmp","images/recMeanCb4.bmp");
  bmInfo_06.biPlanes = bmInfoDef.biPlanes;
  bmInfo_06.biBitCount = bmInfoDef.biBitCount;
  bmInfo_06.biHeight = bmInfoDef.biHeight;
  bmInfo_06.biWidth = bmInfoDef.biWidth;
  bmInfo_06.biSize = bmInfoDef.biSize;
  bmInfo_06.biCompression = bmInfoDef.biCompression;
  bmInfo_06.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_06.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_06.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_06.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_06.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCr,bmFileDef,bmInfo_06,1,4,"images/decMeanCr4.bmp","images/recMeanCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recMeanCb4.bmp","images/recMeanCr4.bmp",
             "images/recoveryMeanRGB4.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"ejection\" x2:\n");
  bmInfo_07.biPlanes = bmInfoDef.biPlanes;
  bmInfo_07.biBitCount = bmInfoDef.biBitCount;
  bmInfo_07.biHeight = bmInfoDef.biHeight;
  bmInfo_07.biWidth = bmInfoDef.biWidth;
  bmInfo_07.biSize = bmInfoDef.biSize;
  bmInfo_07.biCompression = bmInfoDef.biCompression;
  bmInfo_07.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_07.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_07.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_07.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_07.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCb,bmFileDef,bmInfo_07,0,2,"images/decEjectCb2.bmp","images/recEjectCb2.bmp");
  bmInfo_08.biPlanes = bmInfoDef.biPlanes;
  bmInfo_08.biBitCount = bmInfoDef.biBitCount;
  bmInfo_08.biHeight = bmInfoDef.biHeight;
  bmInfo_08.biWidth = bmInfoDef.biWidth;
  bmInfo_08.biSize = bmInfoDef.biSize;
  bmInfo_08.biCompression = bmInfoDef.biCompression;
  bmInfo_08.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_08.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_08.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_08.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_08.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCr,bmFileDef,bmInfo_08,0,2,"images/decEjectCr2.bmp","images/recEjectCr2.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recEjectCb2.bmp","images/recEjectCr2.bmp",
             "images/recoveryEjectRGB2.bmp");
  std::operator<<((ostream *)&std::cout,"\nDecimation \"ejection\" x4:\n");
  bmInfo_09.biPlanes = bmInfoDef.biPlanes;
  bmInfo_09.biBitCount = bmInfoDef.biBitCount;
  bmInfo_09.biHeight = bmInfoDef.biHeight;
  bmInfo_09.biWidth = bmInfoDef.biWidth;
  bmInfo_09.biSize = bmInfoDef.biSize;
  bmInfo_09.biCompression = bmInfoDef.biCompression;
  bmInfo_09.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_09.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_09.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_09.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_09.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCb,bmFileDef,bmInfo_09,0,4,"images/decEjectCb4.bmp","images/recEjectCb4.bmp");
  bmInfo_10.biPlanes = bmInfoDef.biPlanes;
  bmInfo_10.biBitCount = bmInfoDef.biBitCount;
  bmInfo_10.biHeight = bmInfoDef.biHeight;
  bmInfo_10.biWidth = bmInfoDef.biWidth;
  bmInfo_10.biSize = bmInfoDef.biSize;
  bmInfo_10.biCompression = bmInfoDef.biCompression;
  bmInfo_10.biSizeImage = bmInfoDef.biSizeImage;
  bmInfo_10.biXPelsPerMeter = bmInfoDef.biXPelsPerMeter;
  bmInfo_10.biYPelsPerMeter = bmInfoDef.biYPelsPerMeter;
  bmInfo_10.biClrUsed = bmInfoDef.biClrUsed;
  bmInfo_10.biClrImportant = bmInfoDef.biClrImportant;
  decimationAndRecovering
            (mrxCr,bmFileDef,bmInfo_10,0,4,"images/decEjectCr4.bmp","images/recEjectCr4.bmp");
  check_PSNR_for_recov
            ((TRIPLERGB **)mrx1,mrxY,mrxCb,mrxCr,"images/recEjectCb4.bmp","images/recEjectCr4.bmp",
             "images/recoveryEjectRGB4.bmp");
  std::operator<<((ostream *)&std::cout,"-------------------------------------\n");
  piVar8 = getHistFreqFromTriple((TRIPLERGB **)mrx1,h,w,0,"histograms/Part1/histRed/","histRed.csv")
  ;
  N = h * w;
  dVar1 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  piVar8 = getHistFreqFromTriple
                     ((TRIPLERGB **)mrx1,h,w,1,"histograms/Part1/histGreen/","histGreen.csv");
  dVar2 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  piVar8 = getHistFreqFromTriple
                     ((TRIPLERGB **)mrx1,h,w,2,"histograms/Part1/histBlue/","histBlue.csv");
  dVar3 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  piVar8 = getHistFreqFromTriple((TRIPLERGB **)mrx,h,w,0,"histograms/Part1/histY/","histY.csv");
  dVar4 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  piVar8 = getHistFreqFromTriple((TRIPLERGB **)mrx,h,w,1,"histograms/Part1/histCb/","histCb.csv");
  dVar5 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  piVar8 = getHistFreqFromTriple((TRIPLERGB **)mrx,h,w,2,"histograms/Part1/histCr/","histCr.csv");
  dVar6 = getEntropy(piVar8,N);
  if (piVar8 != (int *)0x0) {
    operator_delete__(piVar8);
  }
  std::operator<<((ostream *)&std::cout,"Entropy_Red = ");
  poVar7 = std::ostream::_M_insert<double>(dVar1);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"Entropy_Green = ");
  poVar7 = std::ostream::_M_insert<double>(dVar2);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"Entropy_Blue = ");
  poVar7 = std::ostream::_M_insert<double>(dVar3);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"Entropy_Y = ");
  poVar7 = std::ostream::_M_insert<double>(dVar4);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"Entropy_Cb = ");
  poVar7 = std::ostream::_M_insert<double>(dVar5);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"Entropy_Cr = ");
  poVar7 = std::ostream::_M_insert<double>(dVar6);
  std::operator<<(poVar7,"\n");
  puts("-------------------------------------");
  puts("-------------------------------------");
  puts("-------------------------------------");
  usleep(2000000);
  for (uVar9 = 0; h_00 != uVar9; uVar9 = uVar9 + 1) {
    if (mrx1[uVar9] != (TRIPLEBYTES *)0x0) {
      operator_delete__(mrx1[uVar9]);
    }
    if (mrx[uVar9] != (TRIPLEYCbCr *)0x0) {
      operator_delete__(mrx[uVar9]);
    }
    if (mrxY[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxY[uVar9]);
    }
    if (mrxCb[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxCb[uVar9]);
    }
    if (mrxCr[uVar9] != (TRIPLERGB *)0x0) {
      operator_delete__(mrxCr[uVar9]);
    }
    if (mrx2[uVar9] != (TRIPLEBYTES *)0x0) {
      operator_delete__(mrx2[uVar9]);
    }
  }
  if (mrx1 != (TRIPLEBYTES **)0x0) {
    operator_delete__(mrx1);
  }
  if (mrx != (TRIPLEYCbCr **)0x0) {
    operator_delete__(mrx);
  }
  if (mrxY != (TRIPLERGB **)0x0) {
    operator_delete__(mrxY);
  }
  if (mrxCb != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCb);
  }
  if (mrxCr != (TRIPLERGB **)0x0) {
    operator_delete__(mrxCr);
  }
  if (mrx2 != (TRIPLEBYTES **)0x0) {
    operator_delete__(mrx2);
  }
  return;
}

Assistant:

void example1(const char *filename, const char *file_Y, const char *file_Cb, const char *file_Cr,
              const char *file_rgb_recov) {
    BITMAPFILEHEADER bmFileDef;
    BITMAPINFOHEADER bmInfoDef;
    std::cout << "reading file...\n";
    system("mkdir -p images");
    system("mkdir -p histograms");
    //Read bmp file
    TRIPLERGB **mrxRGB = loadBMPFile(&bmFileDef, &bmInfoDef, filename);
    std::cout << "-------------------------------------\n";
    printHeader(bmFileDef, bmInfoDef);
    std::cout << "-------------------------------------\n";
    size_t defHeight = bmInfoDef.biHeight;
    size_t defWidth = bmInfoDef.biWidth;
    TRIPLERGB **mrxYCbCr = (TRIPLERGB **) RGB2YCbCr(mrxRGB, defHeight, defWidth);

    save_components_to_files(mrxRGB, bmFileDef, bmInfoDef, FORMAT_RGB,
                             "file_Red.bmp", "file_Green.bmp", "file_Blue.bmp");
    save_components_to_files(mrxYCbCr, bmFileDef, bmInfoDef, FORMAT_YCBCR,
                             "file_Y.bmp", "file_Cb.bmp", "file_Cr.bmp");

    TRIPLERGB **mrxY = loadBMPFile(&bmFileDef, &bmInfoDef, file_Y);
    TRIPLERGB **mrxCb = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cb);
    TRIPLERGB **mrxCr = loadBMPFile(&bmFileDef, &bmInfoDef, file_Cr);
    TRIPLERGB **mrxRGBconv = YCbCr2RGB(mrxY, mrxCb, mrxCr, defHeight, defWidth);
    saveBMPFile(bmFileDef, bmInfoDef, mrxRGBconv, file_rgb_recov);

    double PSNR_RGB_RGBr_red = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                       COMPONENT_RED);
    double PSNR_RGB_RGBr_green = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight,
                                         defWidth, COMPONENT_GREEN);
    double PSNR_RGB_RGBr_blue = getPSNR((TRIPLEBYTES **) mrxRGB, (TRIPLEBYTES **) mrxRGBconv, 0, 0, defHeight, defWidth,
                                        COMPONENT_BLUE);
    checkCorrelationProperties(mrxRGB, defHeight, defWidth, FORMAT_RGB);
    checkCorrelationProperties(mrxYCbCr, defHeight, defWidth, FORMAT_YCBCR);
    std::cout << "-------------------------------------\n";
    std::cout << "PSNR(red)[RGB, RGBr] = " << PSNR_RGB_RGBr_red << "\n";
    std::cout << "PSNR(green)[RGB, RGBr] = " << PSNR_RGB_RGBr_green << "\n";
    std::cout << "PSNR(blue)[RGB, RGBr] = " << PSNR_RGB_RGBr_blue << "\n";


    std::cout << "-------------------------------------\n";
    std::cout << "\nDecimation \"mean\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCb2.bmp", "images/recMeanCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 2,
                            "images/decMeanCr2.bmp", "images/recMeanCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb2.bmp", "images/recMeanCr2.bmp",
                         "images/recoveryMeanRGB2.bmp");
    std::cout << "\nDecimation \"mean\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCb4.bmp", "images/recMeanCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_MEAN, 4,
                            "images/decMeanCr4.bmp", "images/recMeanCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recMeanCb4.bmp", "images/recMeanCr4.bmp",
                         "images/recoveryMeanRGB4.bmp");

    std::cout << "\nDecimation \"ejection\" x2:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCb2.bmp", "images/recEjectCb2.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 2,
                            "images/decEjectCr2.bmp", "images/recEjectCr2.bmp");
    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb2.bmp", "images/recEjectCr2.bmp",
                         "images/recoveryEjectRGB2.bmp");
    std::cout << "\nDecimation \"ejection\" x4:\n";
    decimationAndRecovering(mrxCb, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCb4.bmp", "images/recEjectCb4.bmp");
    decimationAndRecovering(mrxCr, bmFileDef, bmInfoDef, DECIMATION_EJECT, 4,
                            "images/decEjectCr4.bmp", "images/recEjectCr4.bmp");

    check_PSNR_for_recov(mrxRGB, mrxY, mrxCb, mrxCr, "images/recEjectCb4.bmp", "images/recEjectCr4.bmp",
                         "images/recoveryEjectRGB4.bmp");
    std::cout << "-------------------------------------\n";

    int *freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histRed/",
                                 "histRed.csv");
    double entropyRed = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histGreen/",
                                 "histGreen.csv");
    double entropyGreen = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxRGB, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histBlue/",
                                 "histBlue.csv");
    double entropyBlue = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_RED, "histograms/Part1/histY/", "histY.csv");
    double entropyY = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_GREEN, "histograms/Part1/histCb/",
                                 "histCb.csv");
    double entropyCb = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    freq = getHistFreqFromTriple(mrxYCbCr, defHeight, defWidth, COMPONENT_BLUE, "histograms/Part1/histCr/",
                                 "histCr.csv");
    double entropyCr = getEntropy(freq, defHeight * defWidth);
    delete[] freq;
    std::cout << "Entropy_Red = " << entropyRed << "\n";
    std::cout << "Entropy_Green = " << entropyGreen << "\n";
    std::cout << "Entropy_Blue = " << entropyBlue << "\n";
    std::cout << "Entropy_Y = " << entropyY << "\n";
    std::cout << "Entropy_Cb = " << entropyCb << "\n";
    std::cout << "Entropy_Cr = " << entropyCr << "\n";
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    printf("-------------------------------------\n");
    usleep(2 * 1000 * 1000);
    //system("csv_charts -h histograms/Part1/histRed/ & exit");
    //system("csv_charts -h histograms/Part1/histGreen/ & exit");
    //system("csv_charts -h histograms/Part1/histBlue/ & exit");
    //system("csv_charts -h histograms/Part1/histY/ & exit");
    //system("csv_charts -h histograms/Part1/histCb/ & exit");
    //system("csv_charts -h histograms/Part1/histCr/ & exit");
    for (int i = 0; i < defHeight; i++) {
        delete[] mrxRGB[i];
        delete[] mrxYCbCr[i];
        delete[] mrxY[i];
        delete[] mrxCb[i];
        delete[] mrxCr[i];
        delete[] mrxRGBconv[i];
    }
    delete[] mrxRGB;
    delete[] mrxYCbCr;
    delete[] mrxY;
    delete[] mrxCb;
    delete[] mrxCr;
    delete[] mrxRGBconv;
}